

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int btreeNext(BtCursor *pCur)

{
  MemPage *pMVar1;
  byte bVar2;
  int iVar3;
  u32 newPgno;
  ushort uVar4;
  undefined8 in_RSI;
  
  bVar2 = pCur->eState;
  if (bVar2 != 0) {
    if (2 < bVar2) {
      iVar3 = btreeRestoreCursorPosition(pCur);
      if (iVar3 != 0) {
        return iVar3;
      }
      bVar2 = pCur->eState;
    }
    if (bVar2 == 1) {
      return 0x65;
    }
    if ((bVar2 == 2) && (pCur->eState = '\0', 0 < pCur->skipNext)) {
      return 0;
    }
  }
  pMVar1 = pCur->pPage;
  uVar4 = pCur->ix + 1;
  pCur->ix = uVar4;
  if (pMVar1->isInit == '\0') {
    iVar3 = sqlite3CorruptError(0x10d51);
    return iVar3;
  }
  if (uVar4 < pMVar1->nCell) {
    if (pMVar1->leaf == '\0') {
LAB_001700d3:
      iVar3 = moveToLeftmost(pCur);
      return iVar3;
    }
  }
  else {
    if (pMVar1->leaf == '\0') {
      newPgno = sqlite3Get4byte(pMVar1->aData + (ulong)pMVar1->hdrOffset + 8);
      iVar3 = moveToChild(pCur,newPgno);
      if (iVar3 != 0) {
        return iVar3;
      }
      goto LAB_001700d3;
    }
    do {
      if (pCur->iPage == '\0') {
        pCur->eState = '\x01';
        return 0x65;
      }
      moveToParent(pCur);
    } while (pCur->pPage->nCell <= pCur->ix);
    if (pCur->pPage->intKey != '\0') {
      iVar3 = sqlite3BtreeNext(pCur,(int)in_RSI);
      return iVar3;
    }
  }
  return 0;
}

Assistant:

static SQLITE_NOINLINE int btreeNext(BtCursor *pCur){
  int rc;
  int idx;
  MemPage *pPage;

  assert( cursorOwnsBtShared(pCur) );
  if( pCur->eState!=CURSOR_VALID ){
    assert( (pCur->curFlags & BTCF_ValidOvfl)==0 );
    rc = restoreCursorPosition(pCur);
    if( rc!=SQLITE_OK ){
      return rc;
    }
    if( CURSOR_INVALID==pCur->eState ){
      return SQLITE_DONE;
    }
    if( pCur->eState==CURSOR_SKIPNEXT ){
      pCur->eState = CURSOR_VALID;
      if( pCur->skipNext>0 ) return SQLITE_OK;
    }
  }

  pPage = pCur->pPage;
  idx = ++pCur->ix;
  if( !pPage->isInit ){
    /* The only known way for this to happen is for there to be a
    ** recursive SQL function that does a DELETE operation as part of a
    ** SELECT which deletes content out from under an active cursor
    ** in a corrupt database file where the table being DELETE-ed from
    ** has pages in common with the table being queried.  See TH3
    ** module cov1/btree78.test testcase 220 (2018-06-08) for an
    ** example. */
    return SQLITE_CORRUPT_BKPT;
  }

  /* If the database file is corrupt, it is possible for the value of idx 
  ** to be invalid here. This can only occur if a second cursor modifies
  ** the page while cursor pCur is holding a reference to it. Which can
  ** only happen if the database is corrupt in such a way as to link the
  ** page into more than one b-tree structure. */
  testcase( idx>pPage->nCell );

  if( idx>=pPage->nCell ){
    if( !pPage->leaf ){
      rc = moveToChild(pCur, get4byte(&pPage->aData[pPage->hdrOffset+8]));
      if( rc ) return rc;
      return moveToLeftmost(pCur);
    }
    do{
      if( pCur->iPage==0 ){
        pCur->eState = CURSOR_INVALID;
        return SQLITE_DONE;
      }
      moveToParent(pCur);
      pPage = pCur->pPage;
    }while( pCur->ix>=pPage->nCell );
    if( pPage->intKey ){
      return sqlite3BtreeNext(pCur, 0);
    }else{
      return SQLITE_OK;
    }
  }
  if( pPage->leaf ){
    return SQLITE_OK;
  }else{
    return moveToLeftmost(pCur);
  }
}